

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O2

uint64_t pack_mode7_to_one_color
                   (color_cell_compressor_params *pParams,color_cell_compressor_results *pResults,
                   uint32_t r,uint32_t g,uint32_t b,uint32_t a,uint8_t *pSelectors,
                   uint32_t num_pixels,color_quad_u8 *pPixels)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint32_t p_1;
  uint uVar8;
  uint uVar9;
  uint64_t uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  undefined1 auStack_44 [8];
  color_quad_u8 p;
  
  uVar7 = 0xffffffff;
  uVar5 = 0;
  for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
    uVar13 = (ulong)(uVar8 >> 1);
    uVar12 = uVar8 & 1;
    uVar11 = (ulong)(uVar12 * 4);
    uVar9 = (uint)*(ushort *)((long)&g_bc7_mode_7_optimal_endpoints[a][uVar13][0].m_error + uVar11)
            + (uint)*(ushort *)
                     ((long)&g_bc7_mode_7_optimal_endpoints[b][uVar13][0].m_error + uVar11) +
            (uint)*(ushort *)((long)&g_bc7_mode_7_optimal_endpoints[g][uVar13][0].m_error + uVar11)
            + (uint)*(ushort *)
                     ((long)&g_bc7_mode_7_optimal_endpoints[r][uVar13][0].m_error + uVar11);
    if ((uVar9 < uVar7) && (uVar5 = (ulong)uVar8, uVar7 = uVar9, uVar9 == 0)) goto LAB_0010901f;
  }
  uVar13 = uVar5 >> 1;
  uVar12 = (uint)uVar5 & 1;
LAB_0010901f:
  uVar7 = uVar12 << 2;
  uVar1 = (&g_bc7_mode_7_optimal_endpoints[g][uVar13][0].m_lo)[uVar7];
  uVar2 = (&g_bc7_mode_7_optimal_endpoints[b][uVar13][0].m_lo)[uVar7];
  uVar3 = (&g_bc7_mode_7_optimal_endpoints[a][uVar13][0].m_lo)[uVar7];
  (pResults->m_low_endpoint).m_c[0] = (&g_bc7_mode_7_optimal_endpoints[r][uVar13][0].m_lo)[uVar7];
  (pResults->m_low_endpoint).m_c[1] = uVar1;
  (pResults->m_low_endpoint).m_c[2] = uVar2;
  (pResults->m_low_endpoint).m_c[3] = uVar3;
  uVar1 = (&g_bc7_mode_7_optimal_endpoints[g][uVar13][0].m_hi)[uVar7];
  uVar2 = (&g_bc7_mode_7_optimal_endpoints[b][uVar13][0].m_hi)[uVar7];
  uVar3 = (&g_bc7_mode_7_optimal_endpoints[a][uVar13][0].m_hi)[uVar7];
  (pResults->m_high_endpoint).m_c[0] = (&g_bc7_mode_7_optimal_endpoints[r][uVar13][0].m_hi)[uVar7];
  (pResults->m_high_endpoint).m_c[1] = uVar1;
  (pResults->m_high_endpoint).m_c[2] = uVar2;
  (pResults->m_high_endpoint).m_c[3] = uVar3;
  pResults->m_pbits[0] = uVar12;
  pResults->m_pbits[1] = (uint32_t)uVar13;
  uVar13 = (ulong)num_pixels;
  for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
    pSelectors[uVar5] = '\x01';
  }
  uVar7 = pResults->m_pbits[0];
  uVar8 = pResults->m_pbits[1];
  for (lVar6 = 8; lVar6 != 0xc; lVar6 = lVar6 + 1) {
    uVar12 = (uint)*(byte *)((long)&((color_cell_compressor_results *)
                                    (&pResults->m_low_endpoint + -2))->m_best_overall_err + lVar6) *
             2 | uVar7;
    uVar9 = (uint)*(byte *)((long)(&pResults->m_low_endpoint + -1) + lVar6) * 2 | uVar8;
    auStack_44[lVar6] =
         (char)((uVar12 >> 6 | uVar12 * 4) * 0x2b + (uVar9 >> 6 | uVar9 * 4) * 0x15 + 0x20 >> 6);
  }
  uVar10 = 0;
  while (bVar14 = uVar13 != 0, uVar13 = uVar13 - 1, bVar14) {
    uVar4 = compute_color_distance_rgba(&p,pPixels,pParams->m_perceptual,pParams->m_weights);
    uVar10 = uVar10 + uVar4;
    pPixels = pPixels + 1;
  }
  pResults->m_best_overall_err = uVar10;
  return uVar10;
}

Assistant:

static uint64_t pack_mode7_to_one_color(const color_cell_compressor_params* pParams, color_cell_compressor_results* pResults, uint32_t r, uint32_t g, uint32_t b, uint32_t a,
	uint8_t* pSelectors, uint32_t num_pixels, const color_quad_u8* pPixels)
{
	uint32_t best_err = UINT_MAX;
	uint32_t best_p = 0;

	for (uint32_t p = 0; p < 4; p++)
	{
		uint32_t hi_p = p >> 1;
		uint32_t lo_p = p & 1;
		uint32_t err = g_bc7_mode_7_optimal_endpoints[r][hi_p][lo_p].m_error + g_bc7_mode_7_optimal_endpoints[g][hi_p][lo_p].m_error + g_bc7_mode_7_optimal_endpoints[b][hi_p][lo_p].m_error + g_bc7_mode_7_optimal_endpoints[a][hi_p][lo_p].m_error;
		if (err < best_err)
		{
			best_err = err;
			best_p = p;
			if (!best_err)
				break;
		}
	}

	uint32_t best_hi_p = best_p >> 1;
	uint32_t best_lo_p = best_p & 1;

	const endpoint_err* pEr = &g_bc7_mode_7_optimal_endpoints[r][best_hi_p][best_lo_p];
	const endpoint_err* pEg = &g_bc7_mode_7_optimal_endpoints[g][best_hi_p][best_lo_p];
	const endpoint_err* pEb = &g_bc7_mode_7_optimal_endpoints[b][best_hi_p][best_lo_p];
	const endpoint_err* pEa = &g_bc7_mode_7_optimal_endpoints[a][best_hi_p][best_lo_p];

	color_quad_u8_set(&pResults->m_low_endpoint, pEr->m_lo, pEg->m_lo, pEb->m_lo, pEa->m_lo);
	color_quad_u8_set(&pResults->m_high_endpoint, pEr->m_hi, pEg->m_hi, pEb->m_hi, pEa->m_hi);
	pResults->m_pbits[0] = best_lo_p;
	pResults->m_pbits[1] = best_hi_p;

	for (uint32_t i = 0; i < num_pixels; i++)
		pSelectors[i] = BC7E_MODE_7_OPTIMAL_INDEX;

	color_quad_u8 p;

	for (uint32_t i = 0; i < 4; i++)
	{
		uint32_t low = (pResults->m_low_endpoint.m_c[i] << 1) | pResults->m_pbits[0];
		uint32_t high = (pResults->m_high_endpoint.m_c[i] << 1) | pResults->m_pbits[1];

		low = (low << 2) | (low >> 6);
		high = (high << 2) | (high >> 6);

		p.m_c[i] = (low * (64 - g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX]) + high * g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX] + 32) >> 6;
	}

	uint64_t total_err = 0;
	for (uint32_t i = 0; i < num_pixels; i++)
		total_err += compute_color_distance_rgba(&p, &pPixels[i], pParams->m_perceptual, pParams->m_weights);

	pResults->m_best_overall_err = total_err;

	return total_err;
}